

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

void __thiscall
irr::core::string<unsigned_long>::string<unsigned_long>
          (string<unsigned_long> *this,unsigned_long *c,s32 lenght)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  unsigned_long *puVar3;
  int local_20;
  s32 l;
  s32 lenght_local;
  unsigned_long *c_local;
  string<unsigned_long> *this_local;
  
  this->array = (unsigned_long *)0x0;
  this->allocated = 0;
  this->used = 0;
  if (c != (unsigned_long *)0x0) {
    this->used = lenght + 1;
    this->allocated = lenght + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->used;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    puVar3 = (unsigned_long *)operator_new__(uVar2);
    this->array = puVar3;
    for (local_20 = 0; local_20 < lenght; local_20 = local_20 + 1) {
      this->array[local_20] = c[local_20];
    }
    this->array[lenght] = 0;
  }
  return;
}

Assistant:

string(const B* c, s32 lenght)
	: array(0), allocated(0), used(0)
	{
		if (!c)
			return;

        allocated = used = lenght+1;
		array = new T[used];

		for (s32 l = 0; l<lenght; ++l)
			array[l] = (T)c[l];

		array[lenght] = 0;
	}